

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_Node16DeleteBeginningMiddleEnd_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node16DeleteBeginningMiddleEnd_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined **ppuVar3;
  ulong k;
  undefined8 *puVar4;
  initializer_list<int> absent_keys;
  value_view v;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_540;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  k = 1;
  puVar4 = &DAT_002ef170;
  ppuVar3 = &PTR_test_value_2_002ef168;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = k;
    uVar2 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffc;
    v._M_extent._M_extent_value = puVar4[uVar2 * -3];
    v._M_ptr = ppuVar3[uVar2 * -3];
    unodb::test::
    tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal(&local_500,k,v,false);
    k = k + 1;
    puVar4 = puVar4 + 2;
    ppuVar3 = ppuVar3 + 2;
  } while (k != 0x11);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,5,false);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,1,false);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,0x10,false);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_500);
  local_540._M_elems[0] = 0x100000000;
  local_540._M_elems[1] = 0x1000000005;
  local_540._M_elems[2] = CONCAT44(local_540._M_elems[2]._4_4_,0x11);
  absent_keys._M_len = 5;
  absent_keys._M_array = (iterator)&local_540;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>(&local_500,absent_keys);
  local_540._M_elems[0] = 0xd;
  local_540._M_elems[1] = 0;
  local_540._M_elems[2] = 1;
  local_540._M_elems[3] = 0;
  local_540._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts(&local_500,&local_540);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
            (&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node16DeleteBeginningMiddleEnd) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 16);

  unodb::test::must_not_allocate([&verifier] {
    verifier.remove(5);
    verifier.remove(1);
    verifier.remove(16);
  });

  verifier.check_present_values();
  verifier.check_absent_keys({0, 1, 5, 16, 17});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({13, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}